

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall spv::Builder::simplifyAccessChainSwizzle(Builder *this)

{
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  iVar3 = getNumTypeConstituents(this,(this->accessChain).preSwizzleBaseType);
  puVar1 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = (long)puVar2 - (long)puVar1 >> 2;
  if (iVar3 <= (int)uVar4) {
    bVar7 = puVar2 != puVar1;
    if (bVar7) {
      if (*puVar1 == 0) {
        uVar6 = 0;
        do {
          uVar5 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar5;
          bVar7 = uVar6 < uVar4;
          if (uVar4 <= uVar6) goto LAB_001bdd5d;
        } while (uVar5 == puVar1[uVar6]);
      }
      if (bVar7) {
        return;
      }
    }
LAB_001bdd5d:
    if (puVar2 != puVar1) {
      (this->accessChain).swizzle.
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    if ((this->accessChain).component == 0) {
      (this->accessChain).preSwizzleBaseType = 0;
    }
  }
  return;
}

Assistant:

void Builder::simplifyAccessChainSwizzle()
{
    // If the swizzle has fewer components than the vector, it is subsetting, and must stay
    // to preserve that fact.
    if (getNumTypeComponents(accessChain.preSwizzleBaseType) > (int)accessChain.swizzle.size())
        return;

    // if components are out of order, it is a swizzle
    for (unsigned int i = 0; i < accessChain.swizzle.size(); ++i) {
        if (i != accessChain.swizzle[i])
            return;
    }

    // otherwise, there is no need to track this swizzle
    accessChain.swizzle.clear();
    if (accessChain.component == NoResult)
        accessChain.preSwizzleBaseType = NoType;
}